

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSLogger.cpp
# Opt level: O2

double __thiscall PSLogger::log(PSLogger *this,double __x)

{
  ostream *poVar1;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  string enum_str;
  allocator<char> local_39;
  string local_38 [32];
  
  if ((int)this->log_verbosity <= in_ESI) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
    std::__cxx11::string::assign((char *)local_38);
    poVar1 = std::operator<<((ostream *)&std::cout,local_38);
    poVar1 = std::operator<<(poVar1," : ");
    poVar1 = std::operator<<(poVar1,in_RDX);
    poVar1 = std::operator<<(poVar1," : ");
    poVar1 = std::operator<<(poVar1,in_RCX);
    std::operator<<(poVar1,"\n");
    __x = (double)std::__cxx11::string::~string(local_38);
  }
  return __x;
}

Assistant:

void PSLogger::log(LogType p_type, std::string p_category, std::string p_msg)
{
    if(p_type < log_verbosity )
    {
        return;
    }

    std::string enum_str = "";
    switch(p_type)
    {
    case LogType::None:
    enum_str = "None";
        break;
    case LogType::VerboseLog:
    enum_str = "VerboseLog";
        break;
    case LogType::Log:
    enum_str = "Log";
        break;
    case LogType::Warning:
    enum_str = "Warning";
        break;
    case LogType::Error:
    enum_str = "Error";
        break;
    case LogType::Critical:
    enum_str = "Critical";
        break;
    default:
    enum_str = "UNKNOWN LOGTYPE";
        break;
    }

    std::cout << enum_str << " : " << p_category << " : " << p_msg << "\n";
}